

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManDfsForCrossCut_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int Entry;
  Gia_Obj_t *pGVar5;
  
  pGVar5 = p->pObjs;
  if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->nObjs)) {
    Entry = (int)((long)pObj - (long)pGVar5 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= Entry) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[Entry] == p->nTravIds) {
      return;
    }
    p->pTravIds[Entry] = p->nTravIds;
    uVar2 = *(ulong *)pObj;
    uVar4 = (uint)uVar2;
    if ((~uVar4 & 0x9fffffff) == 0) {
      if (pObj < pGVar5 + p->nObjs) {
LAB_00240d3a:
        Vec_IntPush(vNodes,Entry);
        return;
      }
    }
    else {
      uVar3 = uVar2 & 0x1fffffff;
      if (uVar3 == 0x1fffffff || -1 < (int)uVar4) {
        if (((int)uVar4 < 0) || ((int)uVar3 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                        ,0x327,
                        "void Gia_ManDfsForCrossCut_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
        }
        puVar1 = &pObj[-uVar3].Value;
        *puVar1 = *puVar1 + 1;
        pObj[-(uVar2 >> 0x20 & 0x1fffffff)].Value = pObj[-(uVar2 >> 0x20 & 0x1fffffff)].Value + 1;
        Gia_ManDfsForCrossCut_rec(p,pObj + -uVar3,vNodes);
        pGVar5 = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
      }
      else {
        pGVar5 = pObj + -uVar3;
        pGVar5->Value = pGVar5->Value + 1;
      }
      Gia_ManDfsForCrossCut_rec(p,pGVar5,vNodes);
      pGVar5 = p->pObjs;
      if ((pGVar5 <= pObj) && (pObj < pGVar5 + p->nObjs)) {
        Entry = (int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555;
        goto LAB_00240d3a;
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManDfsForCrossCut_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    if ( Gia_ObjIsCo(pObj) )
    {
        Gia_ObjFanin0(pObj)->Value++;
        Gia_ManDfsForCrossCut_rec( p, Gia_ObjFanin0(pObj), vNodes );
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjFanin0(pObj)->Value++;
    Gia_ObjFanin1(pObj)->Value++;
    Gia_ManDfsForCrossCut_rec( p, Gia_ObjFanin0(pObj), vNodes );
    Gia_ManDfsForCrossCut_rec( p, Gia_ObjFanin1(pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}